

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Opnd * Lowerer::GetMissingItemOpnd(IRType type,Func *func)

{
  code *pcVar1;
  AddrOpnd *pAVar2;
  IntConstOpnd *pIVar3;
  undefined4 *puVar4;
  int iVar5;
  undefined7 in_register_00000039;
  
  iVar5 = (int)CONCAT71(in_register_00000039,type);
  if (iVar5 == 3) {
    pIVar3 = IR::IntConstOpnd::New(-0x7fffe,TyInt32,func,true);
    return &pIVar3->super_Opnd;
  }
  if (iVar5 == 0x17) {
    pAVar2 = IR::AddrOpnd::New(&DAT_40002fff80002,AddrOpndKindConstantAddress,func,true,(Var)0x0);
    return &pAVar2->super_Opnd;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar4 = 1;
  Js::Throw::ReportAssert
            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
             ,0x4931,"(false)","Only expecting TyVar and TyInt32 in Lowerer::GetMissingItemOpnd");
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

IR::Opnd *
Lowerer::GetMissingItemOpnd(IRType type, Func *func)
{
    if (type == TyVar)
    {
        return IR::AddrOpnd::New(Js::JavascriptArray::MissingItem, IR::AddrOpndKindConstantAddress, func, true);
    }
    if (type == TyInt32)
    {
        return IR::IntConstOpnd::New(Js::JavascriptNativeIntArray::MissingItem, TyInt32, func, true);
    }
    AssertMsg(false, "Only expecting TyVar and TyInt32 in Lowerer::GetMissingItemOpnd");
    __assume(false);
}